

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

char * String::find(char *in,char c)

{
  char *pcStack_18;
  char c_local;
  char *in_local;
  
  pcStack_18 = in;
  while( true ) {
    if (*pcStack_18 == '\0') {
      return (char *)0x0;
    }
    if (*pcStack_18 == c) break;
    pcStack_18 = pcStack_18 + 1;
  }
  return pcStack_18;
}

Assistant:

static const char* find(const char* in, char c)
  {
    for(; *in; ++in)
      if(*in == c)
        return in;
    return 0;
  }